

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_fmovem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint32_t insn,uint32_t ext)

{
  TCGContext_conflict2 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  bool bVar3;
  int is_load;
  int mode;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint32_t ext_local;
  uint32_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar3 = (ext & 0x2000) == 0;
  iVar1 = m68k_feature(s->env,0x15);
  if (iVar1 == 0) {
    addr._4_4_ = 4;
  }
  else {
    addr._4_4_ = 5;
  }
  pTVar2 = gen_lea(env,s,(uint16_t)insn,addr._4_4_);
  if (pTVar2 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    ret = tcg_temp_new_i32(tcg_ctx_00);
    if ((ext >> 0xb & 1) == 0) {
      tcg_gen_movi_i32(tcg_ctx_00,ret,ext & 0xff);
    }
    else {
      tcg_gen_ext8u_i32_m68k(tcg_ctx_00,ret,tcg_ctx_00->cpu_dregs[ext >> 4 & 7]);
    }
    if ((bVar3) || ((ext >> 0xb & 2) != 0)) {
      if (addr._4_4_ == 5) {
        if (bVar3) {
          gen_helper_fmovemx_ld_postinc(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
        }
        else {
          gen_helper_fmovemx_st_postinc(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
        }
      }
      else if (bVar3) {
        gen_helper_fmovemd_ld_postinc(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
      }
      else {
        gen_helper_fmovemd_st_postinc(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
      }
    }
    else if (addr._4_4_ == 5) {
      gen_helper_fmovemx_st_predec(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
    }
    else {
      gen_helper_fmovemd_st_predec(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar2,ret);
    }
    if (((insn & 0x38) == 0x18) || ((insn & 0x38) == 0x20)) {
      pTVar2 = get_areg(s,insn & 7);
      tcg_gen_mov_i32(tcg_ctx_00,pTVar2,ret);
    }
    tcg_temp_free_i32(tcg_ctx_00,ret);
  }
  return;
}

Assistant:

static void gen_op_fmovem(CPUM68KState *env, DisasContext *s,
                          uint32_t insn, uint32_t ext)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv addr, tmp;
    int mode = (ext >> 11) & 0x3;
    int is_load = ((ext & 0x2000) == 0);

    if (m68k_feature(s->env, M68K_FEATURE_FPU)) {
        opsize = OS_EXTENDED;
    } else {
        opsize = OS_DOUBLE;  /* FIXME */
    }

    addr = gen_lea(env, s, insn, opsize);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    tmp = tcg_temp_new(tcg_ctx);
    if (mode & 0x1) {
        /* Dynamic register list */
        tcg_gen_ext8u_i32(tcg_ctx, tmp, DREG(ext, 4));
    } else {
        /* Static register list */
        tcg_gen_movi_i32(tcg_ctx, tmp, ext & 0xff);
    }

    if (!is_load && (mode & 2) == 0) {
        /*
         * predecrement addressing mode
         * only available to store register to memory
         */
        if (opsize == OS_EXTENDED) {
            gen_helper_fmovemx_st_predec(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
        } else {
            gen_helper_fmovemd_st_predec(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
        }
    } else {
        /* postincrement addressing mode */
        if (opsize == OS_EXTENDED) {
            if (is_load) {
                gen_helper_fmovemx_ld_postinc(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
            } else {
                gen_helper_fmovemx_st_postinc(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
            }
        } else {
            if (is_load) {
                gen_helper_fmovemd_ld_postinc(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
            } else {
                gen_helper_fmovemd_st_postinc(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, tmp);
            }
        }
    }
    if ((insn & 070) == 030 || (insn & 070) == 040) {
        tcg_gen_mov_i32(tcg_ctx, AREG(insn, 0), tmp);
    }
    tcg_temp_free(tcg_ctx, tmp);
}